

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui.cpp
# Opt level: O0

void __thiscall
CUI::DoScrollbarOption
          (CUI *this,void *pID,int *pOption,CUIRect *pRect,char *pStr,int Min,int Max,
          IScrollbarScale *pScale,bool Infinite)

{
  uint uVar1;
  ITextRender *pIVar2;
  CUIRect *in_RCX;
  uint *in_RDX;
  CUI *in_RDI;
  undefined8 in_R8;
  int in_R9D;
  long in_FS_OFFSET;
  float fVar3;
  float extraout_XMM0_Da;
  float b;
  float fVar4;
  uint in_stack_00000008;
  long *in_stack_00000010;
  undefined1 in_stack_00000018;
  float VSplitVal;
  float FontSize;
  int Value;
  CUIRect ScrollBar;
  CUIRect Label;
  char aBuf [128];
  char aBufMax [128];
  CUIRect *in_stack_fffffffffffffe58;
  float a;
  undefined8 in_stack_fffffffffffffe70;
  undefined8 in_stack_fffffffffffffe78;
  float Current;
  undefined4 in_stack_fffffffffffffe88;
  undefined3 in_stack_fffffffffffffe98;
  uint uVar5;
  int in_stack_fffffffffffffec8;
  float in_stack_fffffffffffffecc;
  vec4 *in_stack_fffffffffffffed0;
  CUIRect *in_stack_fffffffffffffed8;
  vector4_base<float> local_118;
  char local_108 [16];
  char local_88 [128];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  uVar5 = CONCAT13(in_stack_00000018,in_stack_fffffffffffffe98) & 0x1ffffff;
  uVar1 = *in_RDX;
  if ((char)(uVar5 >> 0x18) != '\0') {
    in_R9D = in_R9D + 1;
    in_stack_00000008 = in_stack_00000008 + 1;
    if (uVar1 == 0) {
      uVar1 = in_stack_00000008;
    }
  }
  str_format(local_88,0x80,"%s: %i",in_R8,(ulong)in_stack_00000008);
  if (((uVar5 & 0x1000000) == 0) || (uVar1 != in_stack_00000008)) {
    str_format(local_108,0x80,"%s: %i",in_R8,(ulong)uVar1);
  }
  else {
    str_format(local_108,0x80,anon_var_dwarf_fadff,in_R8);
  }
  fVar3 = in_RCX->h * 0.8 * 0.8;
  pIVar2 = TextRender(in_RDI);
  (*(pIVar2->super_IInterface)._vptr_IInterface[6])(fVar3,pIVar2,local_108,0xffffffff);
  a = extraout_XMM0_Da;
  pIVar2 = TextRender(in_RDI);
  (*(pIVar2->super_IInterface)._vptr_IInterface[6])(fVar3,pIVar2,local_88,0xffffffff);
  fVar4 = maximum<float>(a,b);
  vector4_base<float>::vector4_base(&local_118,0.0,0.0,0.0,0.25);
  CUIRect::Draw(in_stack_fffffffffffffed8,in_stack_fffffffffffffed0,in_stack_fffffffffffffecc,
                in_stack_fffffffffffffec8);
  CUIRect::VSplitLeft(in_RCX,a,in_stack_fffffffffffffe58,(CUIRect *)0x1ddf96);
  CUIRect::VSplitLeft(in_RCX,a,in_stack_fffffffffffffe58,(CUIRect *)0x1ddfbb);
  DoLabel((CUI *)CONCAT44(uVar1,fVar3),(CUIRect *)CONCAT44(fVar4,in_stack_fffffffffffffe88),
          &in_RDI->m_Enabled,(float)((ulong)in_stack_fffffffffffffe78 >> 0x20),
          (int)in_stack_fffffffffffffe78,(float)((ulong)in_stack_fffffffffffffe70 >> 0x20),
          SUB81((ulong)in_stack_fffffffffffffe70 >> 0x18,0));
  Current = (float)((ulong)in_RDI >> 0x20);
  CUIRect::VMargin(in_RCX,a,in_stack_fffffffffffffe58);
  (**(code **)*in_stack_00000010)(in_stack_00000010,uVar1,in_R9D,in_stack_00000008);
  DoScrollbarH((CUI *)CONCAT44(in_R9D,uVar5),(void *)CONCAT44(uVar1,fVar3),
               (CUIRect *)CONCAT44(fVar4,in_stack_fffffffffffffe88),Current);
  uVar1 = (**(code **)(*in_stack_00000010 + 8))(in_stack_00000010,in_R9D,in_stack_00000008);
  if (((uVar5 & 0x1000000) != 0) && (uVar1 == in_stack_00000008)) {
    uVar1 = 0;
  }
  *in_RDX = uVar1;
  if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
    __stack_chk_fail();
  }
  return;
}

Assistant:

void CUI::DoScrollbarOption(const void *pID, int *pOption, const CUIRect *pRect, const char *pStr, int Min, int Max, const IScrollbarScale *pScale, bool Infinite)
{
	int Value = *pOption;
	if(Infinite)
	{
		Min += 1;
		Max += 1;
		if(Value == 0)
			Value = Max;
	}

	char aBufMax[128];
	str_format(aBufMax, sizeof(aBufMax), "%s: %i", pStr, Max);
	char aBuf[128];
	if(!Infinite || Value != Max)
		str_format(aBuf, sizeof(aBuf), "%s: %i", pStr, Value);
	else
		str_format(aBuf, sizeof(aBuf), "%s: \xe2\x88\x9e", pStr);

	float FontSize = pRect->h*CUI::ms_FontmodHeight*0.8f;
	float VSplitVal = maximum(TextRender()->TextWidth(FontSize, aBuf, -1), TextRender()->TextWidth(FontSize, aBufMax, -1));

	pRect->Draw(vec4(0.0f, 0.0f, 0.0f, 0.25f));

	CUIRect Label, ScrollBar;
	pRect->VSplitLeft(pRect->h+10.0f+VSplitVal, &Label, &ScrollBar);
	Label.VSplitLeft(Label.h+5.0f, 0, &Label);
	DoLabel(&Label, aBuf, FontSize, TEXTALIGN_ML);

	ScrollBar.VMargin(4.0f, &ScrollBar);
	Value = pScale->ToAbsolute(DoScrollbarH(pID, &ScrollBar, pScale->ToRelative(Value, Min, Max)), Min, Max);
	if(Infinite && Value == Max)
		Value = 0;

	*pOption = Value;
}